

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

JSON __thiscall json::anon_unknown_1::parse_next(anon_unknown_1 *this,string *str,size_t *offset)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_type sVar6;
  int iVar7;
  mapped_type *this_00;
  BackingData *pBVar8;
  int *piVar9;
  ulong uVar10;
  BackingData extraout_RAX;
  uint *puVar11;
  long lVar12;
  BackingData extraout_RAX_00;
  BackingData extraout_RAX_01;
  runtime_error *prVar13;
  long *plVar14;
  BackingData BVar15;
  _Alloc_hider this_01;
  undefined8 *puVar16;
  pointer pcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 uVar19;
  anon_unknown_1 aVar20;
  uint uVar21;
  char cVar22;
  ulong uVar23;
  size_t sVar24;
  JSON JVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string val;
  bool b;
  JSON Key;
  JSON Value;
  BackingData local_e0;
  ulong local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  double local_80;
  BackingData local_78 [2];
  undefined1 local_68 [16];
  BackingData local_58 [2];
  undefined1 local_48 [16];
  double local_38;
  
  consume_ws((string *)(str->_M_dataplus)._M_p,offset);
  uVar23 = *offset;
  pcVar17 = (str->_M_dataplus)._M_p;
  bVar1 = pcVar17[uVar23];
  BVar15 = (BackingData)this;
  if (0x6d < bVar1) {
    if (bVar1 == 0x6e) {
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)str);
      iVar7 = std::__cxx11::string::compare((char *)&local_e0.Int);
      uVar19 = extraout_RDX_02;
      if (local_e0.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0) {
        operator_delete(local_e0.List,local_d0._M_allocated_capacity + 1);
        uVar19 = extraout_RDX_03;
      }
      if (iVar7 != 0) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_c0._M_allocated_capacity = (size_type)&local_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"JSON ERROR: Null: Expected \'null\', found \'","");
        std::__cxx11::string::substr((ulong)local_78,(ulong)str);
        std::operator+(&local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.List == paVar18) {
          local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_d0._8_8_ = plVar14[3];
          local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
        }
        else {
          local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_d8 = plVar14[1];
        *plVar14 = (long)paVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::runtime_error::runtime_error(prVar13,(string *)&local_e0.Bool);
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *offset = *offset + 4;
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
      goto LAB_001f147a;
    }
    if (bVar1 == 0x74) {
LAB_001f0ce9:
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)str);
      iVar7 = std::__cxx11::string::compare((char *)&local_e0.Int);
      if (local_e0.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0) {
        operator_delete(local_e0.List,local_d0._M_allocated_capacity + 1);
      }
      if (iVar7 == 0) {
        *offset = *offset + 4;
        aVar20 = (anon_unknown_1)0x1;
        JSON::SetType((JSON *)this,Boolean);
        uVar19 = extraout_RDX_08;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)str);
        iVar7 = std::__cxx11::string::compare((char *)&local_e0.Int);
        if (local_e0.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0) {
          operator_delete(local_e0.List,local_d0._M_allocated_capacity + 1);
        }
        if (iVar7 != 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_c0._M_allocated_capacity = (size_type)&local_b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,
                     "JSON ERROR: Bool: Expected \'true\' or \'false\', found \'","");
          std::__cxx11::string::substr((ulong)local_78,(ulong)str);
          std::operator+(&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.List == paVar18) {
            local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_d0._8_8_ = plVar14[3];
            local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
          }
          else {
            local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          }
          local_d8 = plVar14[1];
          *plVar14 = (long)paVar18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::runtime_error::runtime_error(prVar13,(string *)&local_e0.Bool);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *offset = *offset + 5;
        JSON::SetType((JSON *)this,Boolean);
        aVar20 = (anon_unknown_1)0x0;
        uVar19 = extraout_RDX_01;
      }
      *this = aVar20;
      goto LAB_001f147a;
    }
    if (bVar1 != 0x7b) goto LAB_001f0f2f;
    *(undefined8 *)this = 0;
    *(undefined4 *)(this + 8) = 0;
    JSON::SetType((JSON *)this,Object);
    *offset = *offset + 1;
    consume_ws((string *)(str->_M_dataplus)._M_p,offset);
    BVar15.Int = *offset;
    uVar19 = extraout_RDX;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(BVar15.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->
        _M_local_buf[(long)(str->_M_dataplus)._M_p] != '}') {
      if (BVar15.List <
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str->_M_string_length) {
        do {
          parse_next((anon_unknown_1 *)&local_78[0].Bool,str,offset);
          consume_ws((string *)(str->_M_dataplus)._M_p,offset);
          if ((str->_M_dataplus)._M_p[*offset] != ':') {
            BVar15.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)
                          __cxa_allocate_exception(0x10);
            local_c0._M_allocated_capacity = (size_type)&local_b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"JSON ERROR: Object: Expected colon, found \'","");
            std::operator+(&local_a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0,(str->_M_dataplus)._M_p[*offset]);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0);
            auVar4._8_8_ = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
            auVar4._0_8_ = plVar14;
            auVar26._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar14;
            auVar26._0_8_ = plVar14;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 != paVar18) goto LAB_001f1990;
            local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_d0._8_8_ = plVar14[3];
            goto LAB_001f199d;
          }
          *offset = *offset + 1;
          consume_ws((string *)(str->_M_dataplus)._M_p,offset);
          parse_next((anon_unknown_1 *)&local_58[0].Bool,str,offset);
          JSON::ToString_abi_cxx11_((string *)&local_e0,(JSON *)local_78,(bool *)&local_a0);
          JSON::SetType((JSON *)this,Object);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
                    ::operator[](*(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
                                   **)this,(key_type *)&local_e0);
          JSON::operator=(this_00,(JSON *)local_58);
          if (local_e0.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0) {
            operator_delete(local_e0.List,local_d0._M_allocated_capacity + 1);
          }
          consume_ws((string *)(str->_M_dataplus)._M_p,offset);
          sVar24 = *offset;
          cVar22 = (str->_M_dataplus)._M_p[sVar24];
          if (cVar22 != ',') {
            if (cVar22 != '}') {
              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_c0._M_allocated_capacity = (size_type)&local_b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c0,"JSON ERROR: Object: Expected comma, found \'","");
              std::operator+(&local_a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,(str->_M_dataplus)._M_p[*offset]);
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0);
              local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0.List == paVar18) {
                local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_d0._8_8_ = plVar14[3];
                local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
              }
              else {
                local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
              }
              local_d8 = plVar14[1];
              *plVar14 = (long)paVar18;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              std::runtime_error::runtime_error(prVar13,(string *)&local_e0.Bool);
              __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            *offset = sVar24 + 1;
            JSON::~JSON((JSON *)local_58);
            JSON::~JSON((JSON *)local_78);
            BVar15 = extraout_RAX;
            uVar19 = extraout_RDX_11;
            break;
          }
          *offset = sVar24 + 1;
          JSON::~JSON((JSON *)local_58);
          JSON::~JSON((JSON *)local_78);
          BVar15.Int = *offset;
          uVar19 = extraout_RDX_00;
        } while (BVar15.List <
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)str->_M_string_length);
      }
      goto LAB_001f147a;
    }
LAB_001f12d6:
    *offset = (size_t)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(BVar15.List)->
                            super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->
                       _M_local_buf + 1);
    BVar15.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(BVar15.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->
                   _M_local_buf + 1);
    goto LAB_001f147a;
  }
  if (bVar1 == 0x22) {
    local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
    local_d8 = 0;
    local_d0._M_allocated_capacity = (ulong)(uint7)local_d0._M_allocated_capacity._1_7_ << 8;
    while( true ) {
      *offset = uVar23 + 1;
      cVar22 = (char)&local_e0;
      if (pcVar17[uVar23 + 1] != '\\') break;
      *offset = uVar23 + 2;
      if ((byte)pcVar17[uVar23 + 2] < 0x66) goto switchD_001f0e3f_caseD_6f;
      switch(pcVar17[uVar23 + 2]) {
      case 'n':
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
        break;
      case 'r':
        break;
      case 't':
        break;
      case 'u':
        std::__cxx11::string::append((char *)&local_e0.Int);
        lVar12 = 0;
        do {
          bVar1 = (str->_M_dataplus)._M_p[lVar12 + 1 + *offset];
          if ((9 < (byte)(bVar1 - 0x30)) &&
             ((0x25 < bVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)))
             ) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78[0].List = (deque<json::JSON,_std::allocator<json::JSON>_> *)local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_78,
                       "JSON ERROR: String: Expected hex character in unicode escape, found \'","");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,bVar1);
            plVar14 = (long *)std::__cxx11::string::append(local_c0._M_local_buf);
            local_a0._M_dataplus._M_p = (pointer)*plVar14;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p == paVar18) {
              local_a0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_a0.field_2._8_8_ = plVar14[3];
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            }
            else {
              local_a0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            }
            local_a0._M_string_length = plVar14[1];
            *plVar14 = (long)paVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::runtime_error::runtime_error(prVar13,(string *)&local_a0);
            __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::push_back(cVar22);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        uVar23 = *offset + 4;
        *offset = uVar23;
        goto LAB_001f0dff;
      default:
      }
switchD_001f0e3f_caseD_6f:
      std::__cxx11::string::push_back(cVar22);
      uVar23 = *offset;
LAB_001f0dff:
      pcVar17 = (str->_M_dataplus)._M_p;
    }
    if (pcVar17[uVar23 + 1] != '\"') goto switchD_001f0e3f_caseD_6f;
    *offset = uVar23 + 2;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_e0.List,
               (long)&(local_e0.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_> +
               local_d8);
    JSON::JSON<std::__cxx11::string>((JSON *)this,&local_a0,(type *)0x0);
    uVar19 = extraout_RDX_06;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      uVar19 = extraout_RDX_07;
    }
    BVar15.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
    if (local_e0.List == BVar15.List) goto LAB_001f147a;
  }
  else {
    if (bVar1 == 0x5b) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
      JSON::SetType((JSON *)this,Array);
      *offset = *offset + 1;
      consume_ws((string *)(str->_M_dataplus)._M_p,offset);
      BVar15.Int = *offset;
      uVar19 = extraout_RDX_04;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(BVar15.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->
          _M_local_buf[(long)(str->_M_dataplus)._M_p] != ']') {
        if (BVar15.List <
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str->_M_string_length) {
          uVar21 = 0;
          do {
            parse_next((anon_unknown_1 *)&local_e0.Bool,str,offset);
            pBVar8 = &JSON::operator[]((JSON *)this,(ulong)uVar21)->Internal;
            *pBVar8 = local_e0;
            *(Class *)(pBVar8 + 1) = (Class)local_d8;
            local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)0x0;
            local_d8 = local_d8 & 0xffffffff00000000;
            JSON::~JSON((JSON *)&local_e0);
            consume_ws((string *)(str->_M_dataplus)._M_p,offset);
            BVar15.Int = *offset;
            uVar19 = extraout_RDX_05;
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&(BVar15.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->
                _M_local_buf[(long)(str->_M_dataplus)._M_p] != ',') {
              if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&(BVar15.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->
                  _M_local_buf[(long)(str->_M_dataplus)._M_p] == ']') goto LAB_001f12d6;
              this_01._M_p = (pointer)__cxa_allocate_exception(0x10);
              local_c0._M_allocated_capacity = (size_type)&local_b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c0,"JSON ERROR: Array: Expected \',\' or \']\', found \'",
                         "");
              std::operator+(&local_a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,(str->_M_dataplus)._M_p[*offset]);
              puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
              auVar5._8_8_ = &local_d0;
              auVar5._0_8_ = puVar16;
              auVar27._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar16;
              auVar27._0_8_ = puVar16;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar16 != paVar18) goto LAB_001f19f9;
              local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_d0._8_8_ = puVar16[3];
              goto LAB_001f1a06;
            }
            BVar15.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)
                          (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&(BVar15.List)->
                                super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->
                           _M_local_buf + 1);
            *offset = (size_t)BVar15;
            uVar21 = uVar21 + 1;
          } while (BVar15.List <
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)str->_M_string_length);
        }
        goto LAB_001f147a;
      }
      goto LAB_001f12d6;
    }
    if (bVar1 == 0x66) goto LAB_001f0ce9;
LAB_001f0f2f:
    if (bVar1 != 0x2d && 9 < (byte)(bVar1 - 0x30)) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_allocated_capacity = (size_type)&local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"JSON ERROR: Parse: Unexpected starting character \'","");
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     bVar1);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0);
      local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.List == paVar18) {
        local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_d0._8_8_ = plVar14[3];
        local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
      }
      else {
        local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_d8 = plVar14[1];
      *plVar14 = (long)paVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::runtime_error::runtime_error(prVar13,(string *)&local_e0.Bool);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *(undefined8 *)this = 0;
    *(undefined4 *)(this + 8) = 0;
    local_e0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d0;
    local_d8 = 0;
    local_d0._M_allocated_capacity = (ulong)(uint7)local_d0._M_allocated_capacity._1_7_ << 8;
    paVar18 = &local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_allocated_capacity =
         local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a0._M_dataplus._M_p = (pointer)paVar18;
    if (uVar23 < str->_M_string_length) {
      bVar3 = false;
      do {
        sVar24 = uVar23 + 1;
        *offset = sVar24;
        cVar22 = (str->_M_dataplus)._M_p[uVar23];
        if (cVar22 == 0x2d || (byte)(cVar22 - 0x30U) < 10) {
          std::__cxx11::string::push_back((char)&local_e0);
        }
        else {
          if (cVar22 != '.') {
            uVar10 = str->_M_string_length;
            break;
          }
          bVar3 = true;
          std::__cxx11::string::push_back((char)&local_e0);
        }
        sVar24 = *offset;
        uVar10 = str->_M_string_length;
        uVar23 = sVar24;
      } while (sVar24 < uVar10);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)(uint)(int)cVar22 & 0xffffffffffffffdf);
      if (((char)paVar18 == 'E') && (sVar24 < uVar10)) {
        *offset = sVar24 + 1;
        cVar22 = (str->_M_dataplus)._M_p[sVar24];
        if (cVar22 != '+') {
          if (cVar22 == '-') {
            std::__cxx11::string::push_back((char)&local_a0);
          }
          else {
            *offset = sVar24;
          }
        }
        while (uVar23 = *offset, uVar23 < str->_M_string_length) {
          *offset = uVar23 + 1;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(str->_M_dataplus)._M_p;
          cVar22 = paVar18->_M_local_buf[uVar23];
          if (9 < (byte)(cVar22 - 0x30U)) {
            iVar7 = isspace((int)cVar22);
            if (((iVar7 == 0) && (cVar22 != ',')) && ((cVar22 != ']' && (cVar22 != '}')))) {
              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_58[0].List = (deque<json::JSON,_std::allocator<json::JSON>_> *)local_48;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_58,
                         "JSON ERROR: Number: Expected a number for exponent, found \'","");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_58,cVar22);
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_78[0].Int);
              local_c0._M_allocated_capacity = *plVar14;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_allocated_capacity == paVar18) {
                local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_b0._8_8_ = plVar14[3];
                local_c0._M_allocated_capacity = (size_type)&local_b0;
              }
              else {
                local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
              }
              local_c0._8_8_ = plVar14[1];
              *plVar14 = (long)paVar18;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              std::runtime_error::runtime_error(prVar13,(string *)local_c0._M_local_buf);
              __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            break;
          }
          std::__cxx11::string::push_back((char)&local_a0);
        }
        this_01._M_p = local_a0._M_dataplus._M_p;
        puVar11 = (uint *)__errno_location();
        uVar21 = *puVar11;
        *puVar11 = 0;
        lVar12 = strtol(this_01._M_p,(char **)&local_c0._M_allocated_capacity,10);
        if ((pointer)local_c0._M_allocated_capacity == this_01._M_p) goto LAB_001f19ed;
        uVar2 = *puVar11;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)uVar2;
        if (uVar2 == 0) {
LAB_001f139e:
          *puVar11 = uVar21;
        }
        else if (uVar2 == 0x22) {
          lVar12 = std::__throw_out_of_range("stol");
          goto LAB_001f139e;
        }
        local_80 = (double)lVar12;
        *offset = *offset - 1;
        if (!bVar3) goto LAB_001f1134;
      }
      else {
        if (((sVar24 < uVar10) &&
            (((iVar7 = isspace((int)cVar22), iVar7 == 0 && (cVar22 != ',')) && (cVar22 != ']')))) &&
           (cVar22 != '}')) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_58[0].List = (deque<json::JSON,_std::allocator<json::JSON>_> *)local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,"JSON ERROR: Number: unexpected character \'","");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,cVar22);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_78[0].Int);
          local_c0._M_allocated_capacity = *plVar14;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_allocated_capacity == paVar18) {
            local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_b0._8_8_ = plVar14[3];
            local_c0._M_allocated_capacity = (size_type)&local_b0;
          }
          else {
            local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          }
          local_c0._8_8_ = plVar14[1];
          *plVar14 = (long)paVar18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::runtime_error::runtime_error(prVar13,(string *)local_c0._M_local_buf);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *offset = sVar24 - 1;
        local_80 = 0.0;
        if (!bVar3) goto LAB_001f1134;
        local_80 = 0.0;
        puVar11 = (uint *)__errno_location();
      }
      BVar15 = local_e0;
      uVar21 = *puVar11;
      *puVar11 = 0;
      this_01._M_p = (pointer)&local_c0;
      local_38 = strtod(local_e0.Float,(char **)this_01._M_p);
      if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_c0._M_allocated_capacity ==
          BVar15.List) {
        std::__throw_invalid_argument("stod");
LAB_001f19ed:
        auVar27 = std::__throw_invalid_argument("stol");
LAB_001f19f9:
        local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
        auVar5 = auVar27;
LAB_001f1a06:
        local_e0 = auVar5._8_8_;
        plVar14 = auVar5._0_8_;
        local_d8 = plVar14[1];
        *plVar14 = (long)paVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::runtime_error::runtime_error((runtime_error *)this_01._M_p,(string *)&local_e0.Bool);
        __cxa_throw(this_01._M_p,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*puVar11 == 0) {
LAB_001f1402:
        *puVar11 = uVar21;
      }
      else if (*puVar11 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_001f1402;
      }
      local_80 = pow(10.0,local_80);
      JSON::SetType((JSON *)this,Floating);
      *(double *)this = local_38 * local_80;
      uVar19 = extraout_RDX_12;
    }
    else {
      *offset = uVar23 - 1;
      local_80 = 0.0;
LAB_001f1134:
      sVar6 = local_a0._M_string_length;
      BVar15 = local_e0;
      piVar9 = __errno_location();
      if (sVar6 == 0) {
LAB_001f118f:
        iVar7 = *piVar9;
        *piVar9 = 0;
        lVar12 = strtol(BVar15.Int,(char **)&local_c0._M_allocated_capacity,10);
        if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_c0._M_allocated_capacity ==
            BVar15.List) {
LAB_001f1984:
          auVar26 = std::__throw_invalid_argument("stol");
LAB_001f1990:
          local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          auVar4 = auVar26;
LAB_001f199d:
          local_e0 = auVar4._8_8_;
          plVar14 = auVar4._0_8_;
          local_d8 = plVar14[1];
          *plVar14 = (long)paVar18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::runtime_error::runtime_error((runtime_error *)BVar15.List,(string *)&local_e0.Bool);
          __cxa_throw(BVar15.List,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (*piVar9 == 0) {
          *piVar9 = iVar7;
        }
        else if (*piVar9 == 0x22) {
          std::__throw_out_of_range("stol");
          goto LAB_001f11db;
        }
        JSON::SetType((JSON *)this,Integral);
        *(long *)this = lVar12;
        uVar19 = extraout_RDX_10;
      }
      else {
        iVar7 = *piVar9;
        *piVar9 = 0;
        lVar12 = strtol(BVar15.Int,(char **)&local_c0._M_allocated_capacity,10);
        if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_c0._M_allocated_capacity ==
            BVar15.List) {
          std::__throw_invalid_argument("stol");
          goto LAB_001f1984;
        }
        if (*piVar9 == 0) {
LAB_001f11db:
          *piVar9 = iVar7;
        }
        else if (*piVar9 == 0x22) {
          std::__throw_out_of_range("stol");
          goto LAB_001f118f;
        }
        local_80 = pow(10.0,local_80);
        JSON::SetType((JSON *)this,Floating);
        *(double *)this = local_80 * (double)lVar12;
        uVar19 = extraout_RDX_09;
      }
    }
    BVar15.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_a0.field_2;
    if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_a0._M_dataplus._M_p != BVar15.List)
    {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      BVar15 = extraout_RAX_00;
      uVar19 = extraout_RDX_13;
    }
    if (local_e0 == &local_d0) goto LAB_001f147a;
  }
  operator_delete(local_e0.List,local_d0._M_allocated_capacity + 1);
  BVar15 = extraout_RAX_01;
  uVar19 = extraout_RDX_14;
LAB_001f147a:
  JVar25._8_8_ = uVar19;
  JVar25.Internal.List = BVar15.List;
  return JVar25;
}

Assistant:

JSON parse_next( const string &str, size_t &offset ) {
        char value;
        consume_ws( str, offset );
        value = str[offset];
        switch( value ) {
            case '[' : return parse_array( str, offset );
            case '{' : return parse_object( str, offset );
            case '\"': return parse_string( str, offset );
            case 't' :
            case 'f' : return parse_bool( str, offset );
            case 'n' : return parse_null( str, offset );
            default  : if( ( value <= '9' && value >= '0' ) || value == '-' )
                           return parse_number( str, offset );
        }
        throw std::runtime_error(std::string("JSON ERROR: Parse: Unexpected starting character '") + value + "'");
    }